

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

ValueComparisonResult
duckdb::CompareValueInformation(ExpressionValueInformation *left,ExpressionValueInformation *right)

{
  ExpressionType EVar1;
  ExpressionType EVar2;
  bool bVar3;
  ValueComparisonResult VVar4;
  
  EVar1 = left->comparison_type;
  EVar2 = right->comparison_type;
  if (EVar1 == COMPARE_BOUNDARY_START) {
    switch(EVar2) {
    case COMPARE_NOTEQUAL:
      bVar3 = Value::operator!=(&left->constant,&right->constant);
      break;
    case COMPARE_LESSTHAN:
      bVar3 = Value::operator<(&left->constant,&right->constant);
      break;
    case COMPARE_GREATERTHAN:
      bVar3 = Value::operator>(&left->constant,&right->constant);
      break;
    case COMPARE_LESSTHANOREQUALTO:
      bVar3 = Value::operator<=(&left->constant,&right->constant);
      break;
    case COMPARE_GREATERTHANOREQUALTO:
      bVar3 = Value::operator>=(&left->constant,&right->constant);
      break;
    default:
      bVar3 = Value::operator==(&left->constant,&right->constant);
    }
    return UNSATISFIABLE_CONDITION - bVar3;
  }
  if (EVar2 != COMPARE_BOUNDARY_START) {
    if (EVar1 == COMPARE_NOTEQUAL) {
      switch(EVar2) {
      case COMPARE_LESSTHAN:
        bVar3 = Value::operator>=(&left->constant,&right->constant);
        break;
      case COMPARE_GREATERTHAN:
        bVar3 = Value::operator<=(&left->constant,&right->constant);
        break;
      case COMPARE_LESSTHANOREQUALTO:
        bVar3 = Value::operator>(&left->constant,&right->constant);
        break;
      case COMPARE_GREATERTHANOREQUALTO:
        bVar3 = Value::operator<(&left->constant,&right->constant);
        break;
      default:
        bVar3 = Value::operator==(&left->constant,&right->constant);
      }
      return (uint)(bVar3 ^ 1U) + (uint)(bVar3 ^ 1U) * 2;
    }
    if (EVar2 != COMPARE_NOTEQUAL) {
      if (((EVar1 & 0xfd) == COMPARE_GREATERTHAN) && ((EVar2 & 0xfd) == COMPARE_GREATERTHAN)) {
        bVar3 = Value::operator>(&left->constant,&right->constant);
        if (bVar3) {
          return PRUNE_RIGHT;
        }
        bVar3 = Value::operator<(&left->constant,&right->constant);
        if (bVar3) {
          return PRUNE_LEFT;
        }
        bVar3 = left->comparison_type == COMPARE_GREATERTHANOREQUALTO;
LAB_00d5c01a:
        return (uint)!bVar3;
      }
      if ((EVar1 == COMPARE_LESSTHANOREQUALTO) || (EVar1 == COMPARE_LESSTHAN)) {
        if ((EVar2 == COMPARE_LESSTHANOREQUALTO) || (EVar2 == COMPARE_LESSTHAN)) {
          bVar3 = Value::operator<(&left->constant,&right->constant);
          if (bVar3) {
            return PRUNE_RIGHT;
          }
          bVar3 = Value::operator>(&left->constant,&right->constant);
          if (bVar3) {
            return PRUNE_LEFT;
          }
          bVar3 = left->comparison_type == COMPARE_LESSTHANOREQUALTO;
          goto LAB_00d5c01a;
        }
        if ((EVar1 == COMPARE_LESSTHANOREQUALTO) || (EVar1 == COMPARE_LESSTHAN)) {
          bVar3 = Value::operator>=(&left->constant,&right->constant);
          return bVar3 | UNSATISFIABLE_CONDITION;
        }
      }
    }
  }
  VVar4 = CompareValueInformation(right,left);
  if (VVar4 == PRUNE_RIGHT) {
    return PRUNE_LEFT;
  }
  if (VVar4 == PRUNE_LEFT) {
    return PRUNE_RIGHT;
  }
  return VVar4;
}

Assistant:

ValueComparisonResult CompareValueInformation(ExpressionValueInformation &left, ExpressionValueInformation &right) {
	if (left.comparison_type == ExpressionType::COMPARE_EQUAL) {
		// left is COMPARE_EQUAL, we can either
		// (1) prune the right side or
		// (2) return UNSATISFIABLE
		bool prune_right_side = false;
		switch (right.comparison_type) {
		case ExpressionType::COMPARE_LESSTHAN:
			prune_right_side = left.constant < right.constant;
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			prune_right_side = left.constant <= right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHAN:
			prune_right_side = left.constant > right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			prune_right_side = left.constant >= right.constant;
			break;
		case ExpressionType::COMPARE_NOTEQUAL:
			prune_right_side = left.constant != right.constant;
			break;
		default:
			D_ASSERT(right.comparison_type == ExpressionType::COMPARE_EQUAL);
			prune_right_side = left.constant == right.constant;
			break;
		}
		if (prune_right_side) {
			return ValueComparisonResult::PRUNE_RIGHT;
		} else {
			return ValueComparisonResult::UNSATISFIABLE_CONDITION;
		}
	} else if (right.comparison_type == ExpressionType::COMPARE_EQUAL) {
		// right is COMPARE_EQUAL
		return InvertValueComparisonResult(CompareValueInformation(right, left));
	} else if (left.comparison_type == ExpressionType::COMPARE_NOTEQUAL) {
		// left is COMPARE_NOTEQUAL, we can either
		// (1) prune the left side or
		// (2) not prune anything
		bool prune_left_side = false;
		switch (right.comparison_type) {
		case ExpressionType::COMPARE_LESSTHAN:
			prune_left_side = left.constant >= right.constant;
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			prune_left_side = left.constant > right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHAN:
			prune_left_side = left.constant <= right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			prune_left_side = left.constant < right.constant;
			break;
		default:
			D_ASSERT(right.comparison_type == ExpressionType::COMPARE_NOTEQUAL);
			prune_left_side = left.constant == right.constant;
			break;
		}
		if (prune_left_side) {
			return ValueComparisonResult::PRUNE_LEFT;
		} else {
			return ValueComparisonResult::PRUNE_NOTHING;
		}
	} else if (right.comparison_type == ExpressionType::COMPARE_NOTEQUAL) {
		return InvertValueComparisonResult(CompareValueInformation(right, left));
	} else if (IsGreaterThan(left.comparison_type) && IsGreaterThan(right.comparison_type)) {
		// both comparisons are [>], we can either
		// (1) prune the left side or
		// (2) prune the right side
		if (left.constant > right.constant) {
			// left constant is more selective, prune right
			return ValueComparisonResult::PRUNE_RIGHT;
		} else if (left.constant < right.constant) {
			// right constant is more selective, prune left
			return ValueComparisonResult::PRUNE_LEFT;
		} else {
			// constants are equivalent
			// however we can still have the scenario where one is [>=] and the other is [>]
			// we want to prune the [>=] because [>] is more selective
			// if left is [>=] we prune the left, else we prune the right
			if (left.comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
				return ValueComparisonResult::PRUNE_LEFT;
			} else {
				return ValueComparisonResult::PRUNE_RIGHT;
			}
		}
	} else if (IsLessThan(left.comparison_type) && IsLessThan(right.comparison_type)) {
		// both comparisons are [<], we can either
		// (1) prune the left side or
		// (2) prune the right side
		if (left.constant < right.constant) {
			// left constant is more selective, prune right
			return ValueComparisonResult::PRUNE_RIGHT;
		} else if (left.constant > right.constant) {
			// right constant is more selective, prune left
			return ValueComparisonResult::PRUNE_LEFT;
		} else {
			// constants are equivalent
			// however we can still have the scenario where one is [<=] and the other is [<]
			// we want to prune the [<=] because [<] is more selective
			// if left is [<=] we prune the left, else we prune the right
			if (left.comparison_type == ExpressionType::COMPARE_LESSTHANOREQUALTO) {
				return ValueComparisonResult::PRUNE_LEFT;
			} else {
				return ValueComparisonResult::PRUNE_RIGHT;
			}
		}
	} else if (IsLessThan(left.comparison_type)) {
		D_ASSERT(IsGreaterThan(right.comparison_type));
		// left is [<] and right is [>], in this case we can either
		// (1) prune nothing or
		// (2) return UNSATISFIABLE
		// the SMALLER THAN constant has to be greater than the BIGGER THAN constant
		if (left.constant >= right.constant) {
			return ValueComparisonResult::PRUNE_NOTHING;
		} else {
			return ValueComparisonResult::UNSATISFIABLE_CONDITION;
		}
	} else {
		// left is [>] and right is [<] or [!=]
		D_ASSERT(IsLessThan(right.comparison_type) && IsGreaterThan(left.comparison_type));
		return InvertValueComparisonResult(CompareValueInformation(right, left));
	}
}